

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::sortTrackNoteOffsBeforeOns(MidiFile *this,int track)

{
  int iVar1;
  reference ppMVar2;
  ostream *poVar3;
  int track_local;
  MidiFile *this_local;
  
  if ((-1 < track) && (iVar1 = getTrackCount(this), track < iVar1)) {
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::at
                        (&this->m_events,(long)track);
    MidiEventList::sortNoteOffsBeforeOns(*ppMVar2);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: track ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,track);
  poVar3 = std::operator<<(poVar3," does not exist.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void MidiFile::sortTrackNoteOffsBeforeOns(int track) {
	if ((track >= 0) && (track < getTrackCount())) {
		m_events.at(track)->sortNoteOffsBeforeOns();
	} else {
		std::cerr << "Warning: track " << track << " does not exist." << std::endl;
	}
}